

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_kd_tree_decoder.cc
# Opt level: O0

bool __thiscall
draco::PointCloudKdTreeDecoder::CreateAttributesDecoder
          (PointCloudKdTreeDecoder *this,int32_t att_decoder_id)

{
  bool bVar1;
  PointCloudDecoder *in_RDI;
  pointer in_stack_ffffffffffffff98;
  KdTreeAttributesDecoder *in_stack_ffffffffffffffa0;
  unique_ptr<draco::AttributesDecoder,_std::default_delete<draco::AttributesDecoder>_> *this_00;
  unique_ptr<draco::AttributesDecoder,_std::default_delete<draco::AttributesDecoder>_> *__u;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 uVar2;
  byte bVar3;
  unique_ptr<draco::AttributesDecoder,_std::default_delete<draco::AttributesDecoder>_> local_20;
  unique_ptr<draco::AttributesDecoder,_std::default_delete<draco::AttributesDecoder>_> local_18 [3];
  
  operator_new(0x90);
  KdTreeAttributesDecoder::KdTreeAttributesDecoder(in_stack_ffffffffffffffa0);
  this_00 = &local_20;
  std::unique_ptr<draco::AttributesDecoder,std::default_delete<draco::AttributesDecoder>>::
  unique_ptr<std::default_delete<draco::AttributesDecoder>,void>(this_00,in_stack_ffffffffffffff98);
  __u = local_18;
  std::
  unique_ptr<draco::AttributesDecoderInterface,std::default_delete<draco::AttributesDecoderInterface>>
  ::unique_ptr<draco::AttributesDecoder,std::default_delete<draco::AttributesDecoder>,void>
            ((unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
              *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),__u);
  bVar1 = PointCloudDecoder::SetAttributesDecoder
                    (in_RDI,in_stack_ffffffffffffffb4,
                     (unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                      *)__u);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffb4);
  std::
  unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  ::~unique_ptr((unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                 *)CONCAT44(uVar2,in_stack_ffffffffffffffb0));
  bVar3 = (byte)((uint)uVar2 >> 0x18);
  std::unique_ptr<draco::AttributesDecoder,_std::default_delete<draco::AttributesDecoder>_>::
  ~unique_ptr(this_00);
  return (bool)(bVar3 & 1);
}

Assistant:

bool PointCloudKdTreeDecoder::CreateAttributesDecoder(int32_t att_decoder_id) {
  // Always create the basic attribute decoder.
  return SetAttributesDecoder(
      att_decoder_id,
      std::unique_ptr<AttributesDecoder>(new KdTreeAttributesDecoder()));
}